

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O2

BSDFSample * __thiscall
pbrt::LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
          (BSDFSample *__return_storage_ptr__,
          LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *this,Vector3f wo,
          Float uc,Point2f *u,TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  int iVar7;
  uint64_t sequenceIndex;
  uint64_t seed;
  undefined8 unaff_RBP;
  uint uVar8;
  SampledSpectrum *this_00;
  long in_FS_OFFSET;
  bool bVar9;
  undefined1 auVar10 [16];
  Float FVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined4 extraout_XMM0_Dc;
  undefined8 uVar22;
  undefined1 auVar18 [64];
  undefined1 auVar21 [56];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  SampledSpectrum SVar27;
  Vector3f wo_00;
  Vector3f wo_01;
  Vector3<float> args_1;
  Vector3f local_138;
  undefined4 uStack_12c;
  undefined1 local_128 [16];
  float local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined1 local_108 [16];
  undefined1 local_f8 [8];
  IdealDiffuseBxDF *pIStack_f0;
  SampledSpectrum *local_e8;
  Tuple3<pbrt::Vector3,_float> local_e0;
  undefined4 local_d4;
  TransportMode local_d0;
  HGPhaseFunction phase;
  BSDFSample bs;
  Point2f u_1;
  BSDFSample local_9c;
  undefined1 local_78 [16];
  Vector3f *local_68;
  IdealDiffuseBxDF *local_60;
  SampledSpectrum f;
  anon_class_8_1_ba1d750b r;
  RNG rng;
  undefined1 auVar26 [56];
  
  fVar12 = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar18._8_56_ = wo._8_56_;
  auVar18._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_128 = auVar18._0_16_;
  if (sampleFlags != All) {
    LogFatal<char_const(&)[39]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bxdfs.h"
               ,0x3a3,"Check failed: %s",(char (*) [39])"sampleFlags == BxDFReflTransFlags::All");
  }
  bVar9 = (this->config).twoSided != '\0';
  bVar6 = fVar12 < -fVar12;
  if (bVar6 && bVar9) {
    local_128._0_8_ = auVar18._0_8_ ^ 0x8000000080000000;
    local_128._8_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z ^ 0x80000000;
    local_128._12_4_ = wo._12_4_ ^ 0x80000000;
  }
  local_108._0_4_ = uc;
  local_78._4_12_ = wo._12_12_;
  local_78._0_4_ = (uint)(bVar6 && bVar9) * (int)-fVar12 + (uint)(!bVar6 || !bVar9) * (int)fVar12;
  wo_00.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_128._0_8_;
  if ((float)local_78._0_4_ <= 0.0) {
    wo_01.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_78._0_4_;
    wo_01.super_Tuple3<pbrt::Vector3,_float>.x =
         (float)(int)wo_00.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    wo_01.super_Tuple3<pbrt::Vector3,_float>.y =
         (float)(int)((ulong)wo_00.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20);
    IdealDiffuseBxDF::Sample_f(&local_9c,&this->bottom,wo_01,uc,u,mode,All);
  }
  else {
    wo_00.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_78._0_4_;
    DielectricInterfaceBxDF::Sample_f(&local_9c,&this->top,wo_00,uc,u,mode,All);
  }
  auVar10 = local_128;
  if (0.0 < local_9c.pdf) {
    if ((local_9c.flags & Reflection) != Unset) {
      if (bVar6 && bVar9) {
        auVar10._0_8_ = local_9c.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
        auVar10._8_4_ = 0x80000000;
        auVar10._12_4_ = 0x80000000;
        local_9c.wi.super_Tuple3<pbrt::Vector3,_float>.z =
             -local_9c.wi.super_Tuple3<pbrt::Vector3,_float>.z;
        local_9c.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar10);
      }
      uVar22 = CONCAT44(local_9c.pdf,local_9c.wi.super_Tuple3<pbrt::Vector3,_float>.z);
      __return_storage_ptr__->flags = local_9c.flags;
      goto LAB_0042b336;
    }
    local_138.super_Tuple3<pbrt::Vector3,_float>.z =
         local_9c.wi.super_Tuple3<pbrt::Vector3,_float>.z;
    local_138.super_Tuple3<pbrt::Vector3,_float>.x =
         local_9c.wi.super_Tuple3<pbrt::Vector3,_float>.x;
    local_138.super_Tuple3<pbrt::Vector3,_float>.y =
         local_9c.wi.super_Tuple3<pbrt::Vector3,_float>.y;
    args_1.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_78._0_4_;
    args_1.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_128._0_4_;
    args_1.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_128._4_4_;
    local_128 = auVar10;
    local_d4 = (int)CONCAT71((int7)((ulong)unaff_RBP >> 8),bVar6 && bVar9);
    local_d0 = mode;
    sequenceIndex = Hash<int,pbrt::Vector3<float>>(*(int *)(Options + 4),args_1);
    auVar26 = (undefined1  [56])0x0;
    seed = Hash<float,pbrt::Point2<float>>
                     ((float)local_108._0_4_,(Point2<float>)u->super_Tuple2<pbrt::Point2,_float>);
    RNG::SetSequence(&rng,sequenceIndex,seed);
    auVar1._8_4_ = 0x7fffffff;
    auVar1._0_8_ = 0x7fffffff7fffffff;
    auVar1._12_4_ = 0x7fffffff;
    auVar10 = vandps_avx512vl(ZEXT416((uint)local_9c.wi.super_Tuple3<pbrt::Vector3,_float>.z),auVar1
                             );
    auVar21 = ZEXT856(auVar10._8_8_);
    r.rng = &rng;
    SVar27 = SampledSpectrum::operator*(&local_9c.f,auVar10._0_4_);
    auVar24._0_8_ = SVar27.values.values._8_8_;
    auVar24._8_56_ = auVar26;
    auVar19._0_8_ = SVar27.values.values._0_8_;
    auVar19._8_56_ = auVar21;
    f.values.values = (array<float,_4>)vmovlhps_avx(auVar19._0_16_,auVar24._0_16_);
    this_00 = &this->albedo;
    local_60 = &this->bottom;
    local_68 = &__return_storage_ptr__->wi;
    uVar8 = 0;
    phase.g = this->g;
    local_128._0_4_ = local_9c.pdf;
    auVar13._0_12_ = ZEXT812(0);
    auVar13._12_4_ = 0;
    uVar22 = vcmpss_avx512f(auVar13,ZEXT416((uint)local_78._0_4_),1);
    local_108 = ZEXT416((uint)((byte)uVar22 & 1) * (int)this->thickness);
    local_e8 = this_00;
    for (; uVar8 < (this->config).maxDepth; uVar8 = uVar8 + 1) {
      FVar11 = SampledSpectrum::MaxComponentValue(&f);
      if ((3 < uVar8) && (FVar11 / (float)local_128._0_4_ < 0.25)) {
        auVar10 = vmaxss_avx(ZEXT416((uint)(1.0 - FVar11 / (float)local_128._0_4_)),ZEXT416(0));
        local_118 = auVar10._0_4_;
        fVar12 = Sample_f::anon_class_8_1_ba1d750b::operator()(&r);
        if (fVar12 < local_118) break;
        local_128._0_4_ = (float)local_128._0_4_ * (1.0 - local_118);
      }
      if ((local_138.super_Tuple3<pbrt::Vector3,_float>.z == 0.0) &&
         (!NAN(local_138.super_Tuple3<pbrt::Vector3,_float>.z))) break;
      bVar6 = SampledSpectrum::operator_cast_to_bool(this_00);
      if (bVar6) {
        fVar12 = Sample_f::anon_class_8_1_ba1d750b::operator()(&r);
        auVar2._8_4_ = 0x7fffffff;
        auVar2._0_8_ = 0x7fffffff7fffffff;
        auVar2._12_4_ = 0x7fffffff;
        auVar10 = vandps_avx512vl(ZEXT416((uint)local_138.super_Tuple3<pbrt::Vector3,_float>.z),
                                  auVar2);
        local_118 = SampleExponential(fVar12,1.0 / auVar10._0_4_);
        auVar14._0_12_ = ZEXT412(0);
        auVar14._12_4_ = 0;
        uVar22 = vcmpss_avx512f(auVar14,ZEXT416((uint)local_138.super_Tuple3<pbrt::Vector3,_float>.z
                                               ),1);
        uStack_12c = (float)(CONCAT22(uStack_12c._2_2_,(short)uVar22) & 0xffff0001);
        uStack_114 = extraout_XMM0_Db;
        uStack_110 = extraout_XMM0_Dc;
        uStack_10c = extraout_XMM0_Dd;
        if ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::IdealDiffuseBxDF>::
             Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
             ::reg == '\0') &&
           (iVar7 = __cxa_guard_acquire(&LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::IdealDiffuseBxDF>
                                         ::
                                         Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                         ::reg), iVar7 != 0)) {
          StatRegisterer::StatRegisterer
                    ((StatRegisterer *)
                     &LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::IdealDiffuseBxDF>::
                      Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                      ::reg,const::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,
                     (PixelAccumFunc)0x0);
          __cxa_guard_release(&LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::IdealDiffuseBxDF>::
                               Sample_f(pbrt::Vector3<float>,float,pbrt::Point2<float>const&,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                               ::reg);
          this_00 = local_e8;
        }
        auVar5._4_4_ = uStack_114;
        auVar5._0_4_ = local_118;
        auVar5._8_4_ = uStack_110;
        auVar5._12_4_ = uStack_10c;
        *(long *)(in_FS_OFFSET + -0x80) = *(long *)(in_FS_OFFSET + -0x80) + 1;
        auVar3._8_4_ = 0x80000000;
        auVar3._0_8_ = 0x8000000080000000;
        auVar3._12_4_ = 0x80000000;
        auVar10 = vxorps_avx512vl(auVar5,auVar3);
        fVar12 = (float)local_108._0_4_ +
                 (float)((uint)(SUB41(uStack_12c,0) & 1) * (int)local_118 +
                        (uint)!(bool)(SUB41(uStack_12c,0) & 1) * auVar10._0_4_);
        if ((fVar12 == (float)local_108._0_4_) && (!NAN(fVar12) && !NAN((float)local_108._0_4_))) {
          *(long *)(in_FS_OFFSET + -0x88) = *(long *)(in_FS_OFFSET + -0x88) + 1;
          break;
        }
        if ((fVar12 <= 0.0) || (this->thickness <= fVar12)) {
          if (0.0 <= fVar12) {
            local_108 = vminss_avx(ZEXT416((uint)this->thickness),ZEXT416((uint)fVar12));
            goto LAB_0042b091;
          }
LAB_0042b081:
          local_108 = ZEXT816(0);
LAB_0042b0b4:
          pIStack_f0 = local_60;
          local_f8 = (undefined1  [8])
                     (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)0x0;
          goto LAB_0042b0c3;
        }
        auVar15._0_8_ = local_138.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
        auVar15._8_4_ = 0x80000000;
        auVar15._12_4_ = 0x80000000;
        uVar22 = vmovlps_avx(auVar15);
        pIStack_f0._0_4_ = -local_138.super_Tuple3<pbrt::Vector3,_float>.z;
        local_f8 = (undefined1  [8])uVar22;
        uStack_12c = fVar12;
        local_118 = Sample_f::anon_class_8_1_ba1d750b::operator()(&r);
        local_e0.y = Sample_f::anon_class_8_1_ba1d750b::operator()(&r);
        local_e0.x = local_118;
        HGPhaseFunction::Sample_p
                  ((PhaseFunctionSample *)&bs,&phase,(Vector3f *)local_f8,(Point2f *)&local_e0);
        auVar21 = ZEXT856(0);
        if ((bs.wi.super_Tuple3<pbrt::Vector3,_float>.x <= 0.0) ||
           ((bs.f.values.values[3] == 0.0 && (!NAN(bs.f.values.values[3]))))) goto LAB_0042b1e2;
        auVar26 = (undefined1  [56])0x0;
        SVar27 = SampledSpectrum::operator*(this_00,bs.f.values.values[0]);
        auVar25._0_8_ = SVar27.values.values._8_8_;
        auVar25._8_56_ = auVar21;
        auVar20._0_8_ = SVar27.values.values._0_8_;
        auVar20._8_56_ = auVar26;
        _local_f8 = (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>)
                    vmovlhps_avx(auVar20._0_16_,auVar25._0_16_);
        SampledSpectrum::operator*=(&f,(SampledSpectrum *)local_f8);
        local_128._0_4_ = (float)local_128._0_4_ * bs.wi.super_Tuple3<pbrt::Vector3,_float>.x;
        local_138.super_Tuple3<pbrt::Vector3,_float>.x = bs.f.values.values[1];
        local_138.super_Tuple3<pbrt::Vector3,_float>.y = bs.f.values.values[2];
        local_108 = ZEXT416((uint)uStack_12c);
        local_138.super_Tuple3<pbrt::Vector3,_float>.z = bs.f.values.values[3];
        bVar6 = false;
      }
      else {
        local_118 = this->thickness;
        FVar11 = Tr(local_118,&local_138);
        SampledSpectrum::operator*=(&f,FVar11);
        bVar6 = NAN((float)local_108._0_4_);
        bVar9 = (float)local_108._0_4_ == local_118;
        local_108 = ZEXT416((uint)local_118);
        if ((bVar9) && (!bVar6 && !NAN(local_118))) goto LAB_0042b081;
LAB_0042b091:
        pIStack_f0 = (IdealDiffuseBxDF *)0x0;
        local_f8 = (undefined1  [8])this;
        if ((local_108._0_4_ == 0.0) && (!NAN(local_108._0_4_))) goto LAB_0042b0b4;
LAB_0042b0c3:
        local_118 = Sample_f::anon_class_8_1_ba1d750b::operator()(&r);
        uStack_12c = Sample_f::anon_class_8_1_ba1d750b::operator()(&r);
        u_1.super_Tuple2<pbrt::Point2,_float>.y = Sample_f::anon_class_8_1_ba1d750b::operator()(&r);
        u_1.super_Tuple2<pbrt::Point2,_float>.x = uStack_12c;
        auVar16._0_8_ = local_138.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
        auVar16._8_4_ = 0x80000000;
        auVar16._12_4_ = 0x80000000;
        local_e0.z = -local_138.super_Tuple3<pbrt::Vector3,_float>.z;
        local_e0._0_8_ = vmovlps_avx(auVar16);
        TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                  (&bs,(TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)
                       local_f8,(Vector3f *)&local_e0,local_118,&u_1,local_d0,All);
        if ((bs.pdf <= 0.0) ||
           ((bs.wi.super_Tuple3<pbrt::Vector3,_float>.z == 0.0 &&
            (!NAN(bs.wi.super_Tuple3<pbrt::Vector3,_float>.z))))) {
LAB_0042b1e2:
          __return_storage_ptr__->flags = Unset;
          auVar17 = ZEXT432(0) << 0x20;
          __return_storage_ptr__->f = (SampledSpectrum)auVar17._0_16_;
          __return_storage_ptr__->wi = (Vector3f)auVar17._16_12_;
          __return_storage_ptr__->pdf = (Float)auVar17._28_4_;
          bVar6 = true;
        }
        else {
          SampledSpectrum::operator*=(&f,&bs.f);
          local_128._0_4_ = (float)local_128._0_4_ * bs.pdf;
          local_138.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
               CONCAT44(bs.wi.super_Tuple3<pbrt::Vector3,_float>.y,
                        bs.wi.super_Tuple3<pbrt::Vector3,_float>.x);
          local_138.super_Tuple3<pbrt::Vector3,_float>.z =
               bs.wi.super_Tuple3<pbrt::Vector3,_float>.z;
          if (((undefined1)bs.flags & Transmission) == Unset) {
            auVar4._8_4_ = 0x7fffffff;
            auVar4._0_8_ = 0x7fffffff7fffffff;
            auVar4._12_4_ = 0x7fffffff;
            auVar10 = vandps_avx512vl(ZEXT416((uint)bs.wi.super_Tuple3<pbrt::Vector3,_float>.z),
                                      auVar4);
            SampledSpectrum::operator*=(&f,auVar10._0_4_);
            bVar6 = false;
            this_00 = local_e8;
          }
          else {
            if ((char)local_d4 != '\0') {
              auVar23._0_8_ =
                   local_138.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
              auVar23._8_4_ = 0x80000000;
              auVar23._12_4_ = 0x80000000;
              local_138.super_Tuple3<pbrt::Vector3,_float>.z =
                   -bs.wi.super_Tuple3<pbrt::Vector3,_float>.z;
              local_138.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar23);
            }
            *(undefined8 *)(__return_storage_ptr__->f).values.values = f.values.values._0_8_;
            *(undefined8 *)((__return_storage_ptr__->f).values.values + 2) = f.values.values._8_8_;
            (local_68->super_Tuple3<pbrt::Vector3,_float>).z =
                 local_138.super_Tuple3<pbrt::Vector3,_float>.z;
            (local_68->super_Tuple3<pbrt::Vector3,_float>).x =
                 local_138.super_Tuple3<pbrt::Vector3,_float>.x;
            (local_68->super_Tuple3<pbrt::Vector3,_float>).y =
                 local_138.super_Tuple3<pbrt::Vector3,_float>.y;
            __return_storage_ptr__->pdf = (Float)local_128._0_4_;
            __return_storage_ptr__->flags =
                 (bs.wi.super_Tuple3<pbrt::Vector3,_float>.z * (float)local_78._0_4_ <= 0.0) +
                 GlossyReflection;
            bVar6 = true;
            this_00 = local_e8;
          }
        }
      }
      if (bVar6) {
        return __return_storage_ptr__;
      }
    }
  }
  __return_storage_ptr__->flags = Unset;
  local_9c.f.values.values[0] = 0.0;
  local_9c.f.values.values[1] = 0.0;
  local_9c.f.values.values[2] = 0.0;
  local_9c.f.values.values[3] = 0.0;
  local_9c.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ = 0;
  uVar22 = 0;
LAB_0042b336:
  *(undefined8 *)(__return_storage_ptr__->f).values.values = local_9c.f.values.values._0_8_;
  *(undefined8 *)((__return_storage_ptr__->f).values.values + 2) = local_9c.f.values.values._8_8_;
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)local_9c.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  (__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)local_9c.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20);
  *(undefined8 *)&(__return_storage_ptr__->wi).super_Tuple3<pbrt::Vector3,_float>.z = uVar22;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    BSDFSample Sample_f(Vector3f wo, Float uc, const Point2f &u, TransportMode mode,
                        BxDFReflTransFlags sampleFlags = BxDFReflTransFlags::All) const {
        CHECK(sampleFlags == BxDFReflTransFlags::All);  // for now
        // Set _wo_ for layered BSDF sampling
        bool flipWi = false;
        if (config.twoSided && wo.z < 0) {
            wo = -wo;
            flipWi = true;
        }

        // Sample BSDF at entrance interface to get initial direction _w_
        bool enteredTop = wo.z > 0;
        BSDFSample bs =
            enteredTop ? top.Sample_f(wo, uc, u, mode) : bottom.Sample_f(wo, uc, u, mode);
        if (!bs)
            return {};
        if (bs.IsReflection()) {
            if (flipWi)
                bs.wi = -bs.wi;
            return bs;
        }
        Vector3f w = bs.wi;

        // Declare _RNG_ for layered BSDF sampling
        RNG rng(Hash(GetOptions().seed, wo), Hash(uc, u));
        auto r = [&rng]() {
            return std::min<Float>(rng.Uniform<Float>(), OneMinusEpsilon);
        };

        // Declare common variables for layered BSDF sampling
        SampledSpectrum f = bs.f * AbsCosTheta(bs.wi);
        Float pdf = bs.pdf;
        Float z = enteredTop ? thickness : 0;
        HGPhaseFunction phase(g);

        for (int depth = 0; depth < config.maxDepth; ++depth) {
            // Follow random walk through layeres to sample layered BSDF
            // Possibly terminate layered BSDF sampling with Russian Roulette
            Float rrBeta = f.MaxComponentValue() / pdf;
            if (depth > 3 && rrBeta < 0.25) {
                Float q = std::max<Float>(0, 1 - rrBeta);
                if (r() < q)
                    return {};
                pdf *= 1 - q;
            }
            if (w.z == 0)
                return {};

            if (albedo) {
                // Sample potential scattering event in layered medium
                Float sigma_t = 1;
                Float dz = SampleExponential(r(), sigma_t / AbsCosTheta(w));
                Float zp = w.z > 0 ? (z + dz) : (z - dz);
                CHECK_RARE(1e-5, zp == z);
                if (zp == z)
                    return {};
                if (0 < zp && zp < thickness) {
                    // Update path state for valid scattering event between interfaces
#if 0
// TODO: cancel out and simplify: should be
// f *= AbsCosTheta(w) / sigma_t (!!!) -- that in turn makes the tricky cosine stuff
// more reasonable / palatible...
//f *= Tr(dz, w) / ExponentialPDF(dz, sigma_t / AbsCosTheta(w));
f *= AbsCosTheta(w) / sigma_t;
// Tricky cosines. Always divide here since we always
// include it when we leave a surface.
f /= AbsCosTheta(w);
#endif
                    PhaseFunctionSample ps = phase.Sample_p(-w, Point2f(r(), r()));
                    if (!ps || ps.wi.z == 0)
                        return {};
                    f *= albedo * ps.p;
                    pdf *= ps.pdf;
                    w = ps.wi;
                    z = zp;

                    continue;
                }
                z = Clamp(zp, 0, thickness);
                if (z == 0)
                    DCHECK_LT(w.z, 0);
                else
                    DCHECK_GT(w.z, 0);

            } else {
                // Advance to the other layer interface
                // Bounce back and forth between the top and bottom
                z = (z == thickness) ? 0 : thickness;
                f *= Tr(thickness, w);
            }
            // Initialize _interface_ for current interface surface
            TopOrBottomBxDF<TopBxDF, BottomBxDF> interface;
            if (z == 0)
                interface = &bottom;
            else
                interface = &top;

            // Sample interface BSDF to determine new path direction
            Float uc = r();
            Point2f u(r(), r());
            BSDFSample bs = interface.Sample_f(-w, uc, u, mode);
            if (!bs || bs.wi.z == 0)
                return {};
            f *= bs.f;
            pdf *= bs.pdf;
            w = bs.wi;

            // Return _BSDFSample_ if path has left the layers
            if (bs.IsTransmission()) {
                BxDFFlags flags = SameHemisphere(wo, w) ? BxDFFlags::GlossyReflection
                                                        : BxDFFlags::GlossyTransmission;
                if (flipWi)
                    w = -w;
                return BSDFSample(f, w, pdf, flags);
            }

            // Scale _f_ by cosine term after scattering at the interface
            f *= AbsCosTheta(bs.wi);
        }
        return {};
    }